

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-stats.cc
# Opt level: O3

void __thiscall
wabt::OpcodeInfo::OpcodeInfo<unsigned_int>
          (OpcodeInfo *this,Opcode opcode,Kind kind,uint *data,size_t count,uint extra)

{
  pointer puVar1;
  
  (this->opcode_).enum_ = opcode.enum_;
  this->kind_ = kind;
  (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (count == 0) {
    puVar1 = (pointer)0x4;
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->data_,count << 2);
    puVar1 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start;
    memcpy(puVar1,data,
           (long)(this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar1);
    puVar1 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_finish +
             (4 - (long)(this->data_).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->data_,(size_type_conflict)puVar1);
  *(uint *)((this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish + -4) = extra;
  return;
}

Assistant:

OpcodeInfo::OpcodeInfo(Opcode opcode, Kind kind, T* data, size_t count, T extra)
    : OpcodeInfo(opcode, kind, data, count) {
  data_.resize(data_.size() + sizeof(T));
  memcpy(data_.data() + data_.size() - sizeof(T), &extra, sizeof(T));
}